

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O1

int __thiscall branch_and_reduce_algorithm::max_nh_vtx(branch_and_reduce_algorithm *this)

{
  int iVar1;
  pointer pvVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  int *piVar6;
  pointer piVar7;
  int *piVar8;
  ulong uVar9;
  iterator __begin3;
  ulong uVar10;
  int *piVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int *piVar15;
  
  if (0 < this->n) {
    pvVar2 = (this->adj).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar3 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    piVar4 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar5 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = 0;
    uVar9 = 0xffffffff;
    iVar14 = 0;
    do {
      if (piVar3[uVar13] < 0) {
        iVar12 = (this->used).uid;
        (this->used).uid = iVar12 + 1;
        if (iVar12 < -1) {
          if (piVar4 != piVar5) {
            uVar10 = 0;
            do {
              piVar5[uVar10] = 0;
              uVar10 = uVar10 + 1;
            } while ((uVar10 & 0xffffffff) < (ulong)((long)piVar4 - (long)piVar5 >> 2));
          }
          (this->used).uid = 1;
        }
        piVar11 = pvVar2[uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar6 = *(pointer *)
                  ((long)&pvVar2[uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        if (piVar11 != piVar6) {
          piVar7 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar15 = piVar11;
          do {
            if (piVar3[*piVar15] < 0) {
              piVar7[*piVar15] = (this->used).uid;
            }
            piVar15 = piVar15 + 1;
          } while (piVar15 != piVar6);
        }
        if (piVar11 == piVar6) {
          iVar12 = 0;
        }
        else {
          piVar7 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar12 = 0;
          do {
            piVar8 = *(pointer *)
                      ((long)&pvVar2[*piVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data + 8);
            for (piVar15 = pvVar2[*piVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start; piVar15 != piVar8;
                piVar15 = piVar15 + 1) {
              iVar1 = (this->used).uid;
              if (piVar7[*piVar15] != iVar1) {
                iVar12 = iVar12 + 1;
                piVar7[*piVar15] = iVar1;
              }
            }
            piVar11 = piVar11 + 1;
          } while (piVar11 != piVar6);
        }
        if (iVar14 < iVar12) {
          uVar9 = uVar13 & 0xffffffff;
          iVar14 = iVar12;
        }
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)this->n);
    return (int)uVar9;
  }
  return -1;
}

Assistant:

int branch_and_reduce_algorithm::max_nh_vtx()
{
    int v = -1;
    int maxN2 = 0;

    for (int i = 0; i < n; i++)
    {
        if (x[i] < 0)
        {
            used.clear();
            for (int u : adj[i])
            {
                if (x[u] < 0)
                    used.add(u);
            }

            int cnt = 0;
            for (int u : adj[i])
            {
                for (int v : adj[u])
                {
                    if (!used.get(v))
                    {
                        cnt++;
                        used.add(v);
                    }
                }
            }

            if (cnt > maxN2)
            {
                v = i;
                maxN2 = cnt;
            }
        }
    }

    return v;
}